

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  CLI::App::get_display_name_abi_cxx11_(&local_238,sub,true);
  bVar1 = sub->required_;
  if (bVar1 == true) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"REQUIRED","");
    FormatterBase::get_label(&local_1d8,&this->super_FormatterBase,&local_1f8);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1d8,0,0," ",1);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (paVar2 == paVar5) {
      local_278.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_278.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_278.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_278._M_dataplus._M_p = (pointer)paVar2;
    }
    local_278._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
  }
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    uVar6 = local_238.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_278._M_string_length + local_238._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar6 = local_278.field_2._M_allocated_capacity;
    }
    if (local_278._M_string_length + local_238._M_string_length <= (ulong)uVar6) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_278,0,0,local_238._M_dataplus._M_p,local_238._M_string_length);
      goto LAB_00195c20;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_238,local_278._M_dataplus._M_p,local_278._M_string_length);
LAB_00195c20:
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar2 = &pbVar4->field_2;
  if (paVar5 == paVar2) {
    local_258.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_258.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_258.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
  }
  else {
    local_258.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_258._M_dataplus._M_p = (pointer)paVar5;
  }
  local_258._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar4->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  pcVar3 = (sub->description_)._M_dataplus._M_p;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar3,pcVar3 + (sub->description_)._M_string_length);
  detail::format_help(local_1a8,&local_258,&local_218,(this->super_FormatterBase).column_width_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (bVar1 != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out,
                        sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : ""),
                        sub->get_description(),
                        column_width_);
    return out.str();
}